

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O1

void __thiscall QLabelPrivate::QLabelPrivate(QLabelPrivate *this)

{
  long lVar1;
  
  QFramePrivate::QFramePrivate(&this->super_QFramePrivate);
  *(undefined ***)&(this->super_QFramePrivate).super_QWidgetPrivate = &PTR__QLabelPrivate_008019e8;
  (this->sh).wd.m_i = -1;
  (this->sh).ht.m_i = -1;
  (this->msh).wd.m_i = -1;
  (this->msh).ht.m_i = -1;
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  (this->text).d.size = 0;
  lVar1 = 0;
  (this->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
  super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>._M_engaged
       = false;
  (this->pixmapSize).wd = -1;
  (this->pixmapSize).ht = -1;
  (this->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
  super__Optional_payload<QPicture,_true,_false,_false>.super__Optional_payload_base<QPicture>.
  _M_engaged = false;
  (this->movie).wp = (QWeakPointer<QObject>)0x0;
  do {
    QMetaObject::Connection::Connection
              ((Connection *)((long)&(this->movieConnections)._M_elems[0].d_ptr + lVar1));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x10);
  this->control = (QWidgetTextControl *)0x0;
  QTextCursor::QTextCursor(&this->shortcutCursor);
  QCursor::QCursor(&this->cursor);
  (this->buddy).wp = (QWeakPointer<QObject>)0x0;
  this->shortcutId = 0;
  this->textformat = AutoText;
  this->effectiveTextFormat = PlainText;
  this->textInteractionFlags = (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)0x4;
  this->sizePolicy = (anon_union_4_2_313b0b05_for_QSizePolicy_1)0x0;
  this->margin = 0;
  this->align = 0x481;
  this->indent = -1;
  *(ushort *)&this->field_0x340 = *(ushort *)&this->field_0x340 & 0xfe00;
  (this->resourceProvider).super__Function_base._M_functor = (_Any_data)0x0;
  *(undefined1 (*) [16])&(this->resourceProvider).super__Function_base._M_manager =
       (undefined1  [16])0x0;
  return;
}

Assistant:

QLabelPrivate::QLabelPrivate()
    : QFramePrivate(),
      valid_hints(false),
      scaledcontents(false),
      textLayoutDirty(false),
      textDirty(false),
      isTextLabel(false),
      hasShortcut(false),
#ifndef QT_NO_CURSOR
      validCursor(false),
      onAnchor(false),
#endif
      openExternalLinks(false)
{
}